

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

unique_ptr<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>_> __thiscall
flatbuffers::NewFBSCodeGenerator(flatbuffers *this,bool no_log)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  *puVar1 = &PTR__CodeGenerator_002fb148;
  *(bool *)(puVar1 + 5) = no_log;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
          )(__uniq_ptr_data<flatbuffers::CodeGenerator,_std::default_delete<flatbuffers::CodeGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<CodeGenerator> NewFBSCodeGenerator(const bool no_log) {
  return std::unique_ptr<FBSCodeGenerator>(new FBSCodeGenerator(no_log));
}